

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Index * sqlite3CreateIndex(Parse *pParse,Token *pName1,Token *pName2,SrcList *pTblName,
                          ExprList *pList,int onError,Token *pStart,Expr *pPIWhere,int sortOrder,
                          int ifNotExist)

{
  char cVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  sqlite3 *db;
  ExprList_item *pEVar5;
  Expr *pEVar6;
  Column *pCVar7;
  i16 *piVar8;
  i16 *piVar9;
  long lVar10;
  u8 uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  Table *pTVar15;
  Index *pIVar16;
  Table *pTVar17;
  long lVar18;
  size_t __n;
  CollSeq *pCVar19;
  ulong uVar20;
  void *pvVar21;
  Vdbe *p;
  Index *pIVar22;
  Index *pIVar23;
  u16 uVar24;
  long lVar25;
  int iVar26;
  Schema **ppSVar27;
  Token *pName_00;
  char *pcVar28;
  char *pcVar29;
  uchar uVar30;
  int iVar31;
  uchar uVar32;
  short *psVar33;
  Db *pDVar34;
  ulong uVar35;
  char *local_f8;
  char *local_e8;
  ulong local_d8;
  ExprList *local_d0;
  char *local_c0;
  ExprList_item *local_a0;
  char *local_78;
  Token *pName;
  char *local_68;
  DbFixer sFix;
  
  db = pParse->db;
  pName = (Token *)0x0;
  local_78 = (char *)0x0;
  local_d0 = pList;
  if (((db->mallocFailed != '\0') || (pParse->declareVtab != '\0')) ||
     (iVar12 = sqlite3ReadSchema(pParse), iVar12 != 0)) goto LAB_001411e7;
  if (pTblName != (SrcList *)0x0) {
    uVar13 = sqlite3TwoPartName(pParse,pName1,pName2,&pName);
    if (-1 < (int)uVar13) {
      uVar35 = (ulong)uVar13;
      if ((((db->init).busy == '\0') &&
          (pTVar15 = sqlite3SrcListLookup(pParse,pTblName),
          pTVar15 != (Table *)0x0 && pName2->n == 0)) && (pTVar15->pSchema == db->aDb[1].pSchema)) {
        uVar35 = 1;
      }
      pName_00 = pName;
      pDVar34 = pParse->db->aDb;
      sFix.zDb = pDVar34[uVar35].zName;
      sFix.pSchema = pDVar34[uVar35].pSchema;
      sFix.zType = "index";
      sFix.pName = pName;
      sFix.bVarOnly = (int)((int)uVar35 == 1);
      sFix.pParse = pParse;
      sqlite3FixSrcList(&sFix,pTblName);
      pTVar15 = sqlite3LocateTableItem(pParse,0,pTblName->a);
      if (pTVar15 != (Table *)0x0) {
        if (((int)uVar35 != 1) || (db->aDb[1].pSchema == pTVar15->pSchema)) {
          if ((pTVar15->tabFlags & 0x20) != 0) {
            for (pIVar23 = pTVar15->pIndex; pIVar23 != (Index *)0x0; pIVar23 = pIVar23->pNext) {
              if ((pIVar23->field_0x5b & 3) == 2) goto LAB_001413a8;
            }
          }
          goto LAB_001413a6;
        }
        pcVar29 = pTVar15->zName;
        pcVar28 = "cannot create a TEMP index on non-TEMP table \"%s\"";
LAB_001415e6:
        sqlite3ErrorMsg(pParse,pcVar28,pcVar29);
      }
    }
    goto LAB_001411e7;
  }
  pTVar15 = pParse->pNewTable;
  if (pTVar15 == (Table *)0x0) goto LAB_001411e7;
  uVar35 = 0;
  if (pTVar15->pSchema == (Schema *)0x0) {
    uVar35 = 0xfff0bdc0;
LAB_001413a4:
    pName_00 = (Token *)0x0;
LAB_001413a6:
    pIVar23 = (Index *)0x0;
  }
  else {
    uVar13 = db->nDb;
    if ((int)uVar13 < 1) goto LAB_001413a4;
    ppSVar27 = &db->aDb->pSchema;
    uVar35 = 0;
    do {
      if (*ppSVar27 == pTVar15->pSchema) goto LAB_001413a4;
      uVar35 = uVar35 + 1;
      ppSVar27 = ppSVar27 + 4;
    } while (uVar13 != uVar35);
    pName_00 = (Token *)0x0;
    pIVar23 = (Index *)0x0;
    uVar35 = (ulong)uVar13;
  }
LAB_001413a8:
  iVar12 = (int)uVar35;
  pDVar34 = db->aDb + iVar12;
  pcVar29 = pTVar15->zName;
  if (pcVar29 != (char *)0x0) {
    lVar25 = 0;
    do {
      if ((ulong)(byte)pcVar29[lVar25] == 0) {
        uVar32 = ""[(byte)"sqlite_"[lVar25]];
        uVar30 = '\0';
LAB_001413ff:
        if (uVar30 != uVar32) goto LAB_00141415;
        break;
      }
      uVar30 = ""[(byte)pcVar29[lVar25]];
      uVar32 = ""[(byte)"sqlite_"[lVar25]];
      if (uVar30 != uVar32) goto LAB_001413ff;
      lVar25 = lVar25 + 1;
    } while (lVar25 != 7);
    if ((db->init).busy == '\0') {
      lVar25 = 0;
      do {
        if ((ulong)(byte)pcVar29[lVar25 + 7] == 0) {
          uVar32 = ""[(byte)"altertab_"[lVar25]];
          uVar30 = '\0';
LAB_001415d3:
          if (uVar30 != uVar32) {
            pcVar28 = "table %s may not be indexed";
            goto LAB_001415e6;
          }
          break;
        }
        uVar30 = ""[(byte)pcVar29[lVar25 + 7]];
        uVar32 = ""[(byte)"altertab_"[lVar25]];
        if (uVar30 != uVar32) goto LAB_001415d3;
        lVar25 = lVar25 + 1;
      } while (lVar25 != 9);
    }
  }
LAB_00141415:
  if (pTVar15->pSelect == (Select *)0x0) {
    if ((pTVar15->tabFlags & 0x10) != 0) {
      pcVar29 = "virtual tables may not be indexed";
      goto LAB_001414c6;
    }
    if (pName_00 == (Token *)0x0) {
      for (pIVar16 = pTVar15->pIndex; pIVar16 != (Index *)0x0; pIVar16 = pIVar16->pNext) {
      }
      pcVar29 = sqlite3MPrintf(db,"sqlite_autoindex_%s_%d");
      if (pcVar29 != (char *)0x0) {
LAB_00141552:
        pcVar28 = pDVar34->zName;
        local_68 = "sqlite_master";
        if (iVar12 == 1) {
          local_68 = "sqlite_temp_master";
        }
        iVar14 = sqlite3AuthCheck(pParse,0x12,local_68,(char *)0x0,pcVar28);
        pIVar16 = (Index *)0x0;
        if (iVar14 != 0) goto LAB_001411e9;
        iVar14 = sqlite3AuthCheck(pParse,(uint)(iVar12 == 1) * 2 + 1,pcVar29,pTVar15->zName,pcVar28)
        ;
        if (iVar14 == 0) {
          if (pList == (ExprList *)0x0) {
            local_d0 = (ExprList *)0x0;
            pList = sqlite3ExprListAppend((Parse *)pParse->db,(ExprList *)0x0,(Expr *)0x0);
            if (pList == (ExprList *)0x0) goto LAB_001415c1;
            pcVar28 = sqlite3DbStrDup(pParse->db,pTVar15->aCol[(long)pTVar15->nCol + -1].zName);
            pEVar5 = pList->a;
            pEVar5->zName = pcVar28;
            pEVar5->sortOrder = (u8)sortOrder;
          }
          iVar14 = pList->nExpr;
          if ((long)iVar14 < 1) {
            iVar26 = 1;
          }
          else {
            lVar25 = 0;
            iVar26 = 0;
            do {
              pEVar6 = pList->a[lVar25].pExpr;
              if (pEVar6 != (Expr *)0x0) {
                pcVar28 = (pEVar6->u).zToken;
                if (pcVar28 == (char *)0x0) {
                  iVar31 = 1;
                }
                else {
                  uVar13 = 0xffffffff;
                  do {
                    uVar13 = uVar13 + 1;
                    cVar1 = *pcVar28;
                    pcVar28 = pcVar28 + 1;
                  } while (cVar1 != '\0');
                  iVar31 = (uVar13 & 0x3fffffff) + 1;
                }
                iVar26 = iVar26 + iVar31;
              }
              lVar25 = lVar25 + 1;
            } while (lVar25 != iVar14);
            iVar26 = iVar26 + 1;
          }
          lVar25 = 0;
          do {
            pcVar28 = pcVar29 + lVar25;
            lVar25 = lVar25 + 1;
          } while (*pcVar28 != '\0');
          uVar13 = (int)lVar25 - 1U & 0x3fffffff;
          if (pIVar23 == (Index *)0x0) {
            uVar24 = 1;
          }
          else {
            uVar24 = pIVar23->nKeyCol;
          }
          pIVar16 = sqlite3AllocateIndexObject(db,(short)iVar14 + uVar24,iVar26 + uVar13,&local_78);
          local_c0 = local_78;
          local_d0 = pList;
          if (db->mallocFailed == '\0') {
            pIVar16->zName = local_78;
            memcpy(local_78,pcVar29,(ulong)uVar13 + 1);
            pIVar16->pTable = pTVar15;
            pIVar16->onError = (u8)onError;
            pIVar16->field_0x5b =
                 pIVar16->field_0x5b & 0xf4 | (onError != 0) * '\b' + (pName_00 == (Token *)0x0);
            pIVar16->pSchema = db->aDb[iVar12].pSchema;
            iVar14 = pList->nExpr;
            pIVar16->nKeyCol = (u16)iVar14;
            if (pPIWhere != (Expr *)0x0) {
              sqlite3ResolveSelfReference(pParse,pTVar15,0x10,pPIWhere,(ExprList *)0x0);
              pIVar16->pPartIdxWhere = pPIWhere;
              iVar14 = pList->nExpr;
            }
            if (iVar14 < 1) {
              local_d8 = 0;
            }
            else {
              local_c0 = local_c0 + (ulong)uVar13 + 1;
              bVar2 = pDVar34->pSchema->file_format;
              local_a0 = pList->a;
              pPIWhere = (Expr *)0x0;
              local_d8 = 0;
              do {
                pcVar28 = local_a0->zName;
                sVar3 = pTVar15->nCol;
                if (sVar3 < 1) {
LAB_001419d7:
                  pPIWhere = (Expr *)0x0;
                  sqlite3ErrorMsg(pParse,"table %s has no column named %s",pTVar15->zName,pcVar28);
                  pParse->checkSchema = '\x01';
                  goto LAB_001419fe;
                }
                pCVar7 = pTVar15->aCol;
                lVar25 = 0;
                iVar14 = 0;
                while (iVar26 = sqlite3_stricmp(pcVar28,*(char **)((long)&pCVar7->zName + lVar25)),
                      iVar26 != 0) {
                  iVar14 = iVar14 + 1;
                  lVar25 = lVar25 + 0x30;
                  if (sVar3 == iVar14) goto LAB_001419d7;
                }
                pIVar16->aiColumn[local_d8] = (i16)iVar14;
                if (local_a0->pExpr == (Expr *)0x0) {
                  local_f8 = local_c0;
                  local_c0 = *(char **)((long)&pCVar7->zColl + lVar25);
                  if (local_c0 == (char *)0x0) {
                    local_c0 = "BINARY";
                  }
                }
                else {
                  pcVar28 = (local_a0->pExpr->u).zToken;
                  if (pcVar28 == (char *)0x0) {
                    __n = 1;
                  }
                  else {
                    lVar18 = -1;
                    do {
                      lVar10 = lVar18 + 1;
                      lVar18 = lVar18 + 1;
                    } while (pcVar28[lVar10] != '\0');
                    __n = (ulong)((uint)lVar18 & 0x3fffffff) + 1;
                  }
                  memcpy(local_c0,pcVar28,__n);
                  local_f8 = local_c0 + __n;
                }
                if (((db->init).busy == '\0') &&
                   (pCVar19 = sqlite3LocateCollSeq(pParse,local_c0), pCVar19 == (CollSeq *)0x0))
                goto LAB_001419fe;
                uVar11 = '\0';
                pIVar16->azColl[local_d8] = local_c0;
                if (3 < bVar2) {
                  uVar11 = (u8)*(undefined4 *)&local_a0->sortOrder;
                }
                pIVar16->aSortOrder[local_d8] = uVar11;
                if ((&pTVar15->aCol->notNull)[lVar25] == '\0') {
                  pIVar16->field_0x5b = pIVar16->field_0x5b & 0xf7;
                }
                local_d8 = local_d8 + 1;
                local_a0 = local_a0 + 1;
                local_c0 = local_f8;
              } while ((long)local_d8 < (long)pList->nExpr);
            }
            if (pIVar23 == (Index *)0x0) {
              pIVar16->aiColumn[local_d8 & 0xffffffff] = -1;
              pIVar16->azColl[local_d8 & 0xffffffff] = "BINARY";
            }
            else {
              uVar35 = (ulong)pIVar23->nKeyCol;
              if (pIVar23->nKeyCol != 0) {
                uVar20 = 0;
                do {
                  uVar13 = (uint)pIVar16->nKeyCol;
                  psVar33 = pIVar16->aiColumn;
                  do {
                    if ((int)uVar13 < 1) {
                      iVar14 = (int)local_d8;
                      pIVar16->aiColumn[iVar14] = pIVar23->aiColumn[uVar20];
                      pIVar16->azColl[iVar14] = pIVar23->azColl[uVar20];
                      pIVar16->aSortOrder[iVar14] = pIVar23->aSortOrder[uVar20];
                      local_d8 = (ulong)(iVar14 + 1);
                      uVar35 = (ulong)pIVar23->nKeyCol;
                      goto LAB_00141a9c;
                    }
                    uVar13 = uVar13 - 1;
                    sVar3 = *psVar33;
                    psVar33 = psVar33 + 1;
                  } while (sVar3 != pIVar23->aiColumn[uVar20]);
                  pIVar16->nColumn = pIVar16->nColumn - 1;
LAB_00141a9c:
                  uVar20 = uVar20 + 1;
                } while (uVar20 < uVar35);
              }
            }
            sqlite3DefaultRowEst(pIVar16);
            pTVar17 = pParse->pNewTable;
            if (pTVar17 == (Table *)0x0) {
              estimateIndexWidth(pIVar16);
              pTVar17 = pParse->pNewTable;
            }
            if ((pTVar15 == pTVar17) && (pIVar23 = pTVar15->pIndex, pIVar23 != (Index *)0x0)) {
              uVar4 = pIVar16->nKeyCol;
              do {
                if (pIVar23->nKeyCol == uVar4) {
                  if ((ulong)uVar4 == 0) {
                    uVar35 = 0;
                  }
                  else {
                    piVar8 = pIVar23->aiColumn;
                    piVar9 = pIVar16->aiColumn;
                    uVar35 = 0;
                    while (piVar8[uVar35] == piVar9[uVar35]) {
                      if ((pIVar23->azColl[uVar35] != pIVar16->azColl[uVar35]) &&
                         (iVar14 = sqlite3_stricmp(pIVar23->azColl[uVar35],pIVar16->azColl[uVar35]),
                         iVar14 != 0)) break;
                      uVar35 = uVar35 + 1;
                      if (uVar4 == uVar35) goto LAB_00141d4d;
                    }
                  }
                  local_f8._0_4_ = (uint)uVar4;
                  if ((uint)uVar35 == (uint)local_f8) {
LAB_00141d4d:
                    uVar11 = pIVar23->onError;
                    if (uVar11 != pIVar16->onError) {
                      if ((uVar11 != '\n') && (pIVar16->onError != '\n')) {
                        sqlite3ErrorMsg(pParse,"conflicting ON CONFLICT clauses specified",0);
                        uVar11 = pIVar23->onError;
                      }
                      if (uVar11 == '\n') {
                        pIVar23->onError = pIVar16->onError;
                      }
                    }
                    pPIWhere = (Expr *)0x0;
                    goto LAB_00141a09;
                  }
                }
                pIVar23 = pIVar23->pNext;
              } while (pIVar23 != (Index *)0x0);
            }
            if ((db->init).busy == '\0') {
              if (pParse->nErr != 0) goto LAB_00141da2;
              if ((pTblName != (SrcList *)0x0) || ((pTVar15->tabFlags & 0x20) == 0)) {
                uVar13 = pParse->nMem + 1;
                pParse->nMem = uVar13;
                p = sqlite3GetVdbe(pParse);
                if (p == (Vdbe *)0x0) goto LAB_00141db4;
                sqlite3BeginWriteOperation(pParse,1,iVar12);
                local_e8 = (char *)0x0;
                sqlite3VdbeAddOp3(p,0x78,iVar12,uVar13,0);
                if (pStart != (Token *)0x0) {
                  iVar14 = (*(int *)&(pParse->sLastToken).z - (int)pName_00->z) +
                           (pParse->sLastToken).n;
                  pcVar28 = " UNIQUE";
                  if (onError == 0) {
                    pcVar28 = "";
                  }
                  local_e8 = sqlite3MPrintf(db,"CREATE%s INDEX %.*s",pcVar28,
                                            (ulong)(iVar14 - (uint)(pName_00->z[(long)iVar14 + -1]
                                                                   == ';')));
                }
                sqlite3NestedParse(pParse,"INSERT INTO %Q.%s VALUES(\'index\',%Q,%Q,#%d,%Q);",
                                   db->aDb[iVar12].zName,local_68,pIVar16->zName,pTVar15->zName,
                                   (ulong)uVar13,local_e8);
                sqlite3DbFree(db,local_e8);
                if (pTblName != (SrcList *)0x0) {
                  sqlite3RefillIndex(pParse,pIVar16,uVar13);
                  sqlite3ChangeCookie(pParse,iVar12);
                  pcVar28 = sqlite3MPrintf(db,"name=\'%q\' AND type=\'index\'",pIVar16->zName);
                  sqlite3VdbeAddParseSchemaOp(p,iVar12,pcVar28);
                  sqlite3VdbeAddOp3(p,0x90,0,0,0);
                  goto LAB_00141da2;
                }
              }
            }
            else {
              pvVar21 = sqlite3HashInsert(&pIVar16->pSchema->idxHash,pIVar16->zName,pIVar16);
              if (pvVar21 != (void *)0x0) {
                db->mallocFailed = '\x01';
                pPIWhere = (Expr *)0x0;
                pIVar23 = (Index *)0x0;
                goto LAB_00141a09;
              }
              *(byte *)&db->flags = (byte)db->flags | 2;
              if (pTblName == (SrcList *)0x0) goto LAB_00141dbc;
              pIVar16->tnum = (db->init).newTnum;
LAB_00141da2:
              if ((pTblName != (SrcList *)0x0) && ((db->init).busy == '\0')) {
LAB_00141db4:
                pPIWhere = (Expr *)0x0;
                goto LAB_001419fe;
              }
            }
LAB_00141dbc:
            pIVar23 = pTVar15->pIndex;
            if (onError == 5) {
              if (pIVar23 == (Index *)0x0) {
                pIVar23 = (Index *)0x0;
                goto LAB_00141df5;
              }
              if (pIVar23->onError == '\x05') goto LAB_00141df5;
              do {
                pIVar22 = pIVar23;
                pIVar23 = pIVar22->pNext;
                if (pIVar23 == (Index *)0x0) break;
              } while (pIVar23->onError != '\x05');
              pIVar16->pNext = pIVar23;
              pIVar22->pNext = pIVar16;
            }
            else {
LAB_00141df5:
              pIVar16->pNext = pIVar23;
              pTVar15->pIndex = pIVar16;
            }
            pPIWhere = (Expr *)0x0;
            goto LAB_001411e9;
          }
LAB_001419fe:
          pIVar23 = (Index *)0x0;
          if (pIVar16 != (Index *)0x0) {
LAB_00141a09:
            freeIndex(db,pIVar16);
            pIVar16 = pIVar23;
            goto LAB_001411e9;
          }
        }
LAB_001415c1:
        pIVar16 = (Index *)0x0;
        goto LAB_001411e9;
      }
    }
    else {
      pcVar29 = sqlite3NameFromToken(db,pName_00);
      if (pcVar29 != (char *)0x0) {
        iVar14 = sqlite3CheckObjectName(pParse,pcVar29);
        if (iVar14 == 0) {
          if (((db->init).busy == '\0') &&
             (pTVar17 = sqlite3FindTable(db,pcVar29,(char *)0x0), pTVar17 != (Table *)0x0)) {
            pcVar28 = "there is already a table named %s";
          }
          else {
            pIVar16 = sqlite3FindIndex(db,pcVar29,pDVar34->zName);
            if (pIVar16 == (Index *)0x0) goto LAB_00141552;
            if (ifNotExist != 0) {
              sqlite3CodeVerifySchema(pParse,iVar12);
              goto LAB_001415c1;
            }
            pcVar28 = "index %s already exists";
          }
          sqlite3ErrorMsg(pParse,pcVar28,pcVar29);
          pIVar16 = (Index *)0x0;
          goto LAB_001411e9;
        }
        goto LAB_001415c1;
      }
    }
  }
  else {
    pcVar29 = "views may not be indexed";
LAB_001414c6:
    sqlite3ErrorMsg(pParse,pcVar29);
  }
LAB_001411e7:
  pcVar29 = (char *)0x0;
  pIVar16 = (Index *)0x0;
LAB_001411e9:
  sqlite3ExprDelete(db,pPIWhere);
  sqlite3ExprListDelete(db,local_d0);
  sqlite3SrcListDelete(db,pTblName);
  sqlite3DbFree(db,pcVar29);
  return pIVar16;
}

Assistant:

SQLITE_PRIVATE Index *sqlite3CreateIndex(
  Parse *pParse,     /* All information about this parse */
  Token *pName1,     /* First part of index name. May be NULL */
  Token *pName2,     /* Second part of index name. May be NULL */
  SrcList *pTblName, /* Table to index. Use pParse->pNewTable if 0 */
  ExprList *pList,   /* A list of columns to be indexed */
  int onError,       /* OE_Abort, OE_Ignore, OE_Replace, or OE_None */
  Token *pStart,     /* The CREATE token that begins this statement */
  Expr *pPIWhere,    /* WHERE clause for partial indices */
  int sortOrder,     /* Sort order of primary key when pList==NULL */
  int ifNotExist     /* Omit error if index already exists */
){
  Index *pRet = 0;     /* Pointer to return */
  Table *pTab = 0;     /* Table to be indexed */
  Index *pIndex = 0;   /* The index to be created */
  char *zName = 0;     /* Name of the index */
  int nName;           /* Number of characters in zName */
  int i, j;
  DbFixer sFix;        /* For assigning database names to pTable */
  int sortOrderMask;   /* 1 to honor DESC in index.  0 to ignore. */
  sqlite3 *db = pParse->db;
  Db *pDb;             /* The specific table containing the indexed database */
  int iDb;             /* Index of the database that is being written */
  Token *pName = 0;    /* Unqualified name of the index to create */
  struct ExprList_item *pListItem; /* For looping over pList */
  const Column *pTabCol;           /* A column in the table */
  int nExtra = 0;                  /* Space allocated for zExtra[] */
  int nExtraCol;                   /* Number of extra columns needed */
  char *zExtra = 0;                /* Extra space after the Index object */
  Index *pPk = 0;      /* PRIMARY KEY index for WITHOUT ROWID tables */

  assert( pParse->nErr==0 );      /* Never called with prior errors */
  if( db->mallocFailed || IN_DECLARE_VTAB ){
    goto exit_create_index;
  }
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_create_index;
  }

  /*
  ** Find the table that is to be indexed.  Return early if not found.
  */
  if( pTblName!=0 ){

    /* Use the two-part index name to determine the database 
    ** to search for the table. 'Fix' the table name to this db
    ** before looking up the table.
    */
    assert( pName1 && pName2 );
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) goto exit_create_index;
    assert( pName && pName->z );

#ifndef SQLITE_OMIT_TEMPDB
    /* If the index name was unqualified, check if the table
    ** is a temp table. If so, set the database to 1. Do not do this
    ** if initialising a database schema.
    */
    if( !db->init.busy ){
      pTab = sqlite3SrcListLookup(pParse, pTblName);
      if( pName2->n==0 && pTab && pTab->pSchema==db->aDb[1].pSchema ){
        iDb = 1;
      }
    }
#endif

    sqlite3FixInit(&sFix, pParse, iDb, "index", pName);
    if( sqlite3FixSrcList(&sFix, pTblName) ){
      /* Because the parser constructs pTblName from a single identifier,
      ** sqlite3FixSrcList can never fail. */
      assert(0);
    }
    pTab = sqlite3LocateTableItem(pParse, 0, &pTblName->a[0]);
    assert( db->mallocFailed==0 || pTab==0 );
    if( pTab==0 ) goto exit_create_index;
    if( iDb==1 && db->aDb[iDb].pSchema!=pTab->pSchema ){
      sqlite3ErrorMsg(pParse, 
           "cannot create a TEMP index on non-TEMP table \"%s\"",
           pTab->zName);
      goto exit_create_index;
    }
    if( !HasRowid(pTab) ) pPk = sqlite3PrimaryKeyIndex(pTab);
  }else{
    assert( pName==0 );
    assert( pStart==0 );
    pTab = pParse->pNewTable;
    if( !pTab ) goto exit_create_index;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  }
  pDb = &db->aDb[iDb];

  assert( pTab!=0 );
  assert( pParse->nErr==0 );
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
       && db->init.busy==0
#if SQLITE_USER_AUTHENTICATION
       && sqlite3UserAuthTable(pTab->zName)==0
#endif
       && sqlite3StrNICmp(&pTab->zName[7],"altertab_",9)!=0 ){
    sqlite3ErrorMsg(pParse, "table %s may not be indexed", pTab->zName);
    goto exit_create_index;
  }
#ifndef SQLITE_OMIT_VIEW
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "views may not be indexed");
    goto exit_create_index;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be indexed");
    goto exit_create_index;
  }
#endif

  /*
  ** Find the name of the index.  Make sure there is not already another
  ** index or table with the same name.  
  **
  ** Exception:  If we are reading the names of permanent indices from the
  ** sqlite_master table (because some other process changed the schema) and
  ** one of the index names collides with the name of a temporary table or
  ** index, then we will continue to process this index.
  **
  ** If pName==0 it means that we are
  ** dealing with a primary key or UNIQUE constraint.  We have to invent our
  ** own name.
  */
  if( pName ){
    zName = sqlite3NameFromToken(db, pName);
    if( zName==0 ) goto exit_create_index;
    assert( pName->z!=0 );
    if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
      goto exit_create_index;
    }
    if( !db->init.busy ){
      if( sqlite3FindTable(db, zName, 0)!=0 ){
        sqlite3ErrorMsg(pParse, "there is already a table named %s", zName);
        goto exit_create_index;
      }
    }
    if( sqlite3FindIndex(db, zName, pDb->zName)!=0 ){
      if( !ifNotExist ){
        sqlite3ErrorMsg(pParse, "index %s already exists", zName);
      }else{
        assert( !db->init.busy );
        sqlite3CodeVerifySchema(pParse, iDb);
      }
      goto exit_create_index;
    }
  }else{
    int n;
    Index *pLoop;
    for(pLoop=pTab->pIndex, n=1; pLoop; pLoop=pLoop->pNext, n++){}
    zName = sqlite3MPrintf(db, "sqlite_autoindex_%s_%d", pTab->zName, n);
    if( zName==0 ){
      goto exit_create_index;
    }
  }

  /* Check for authorization to create an index.
  */
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    const char *zDb = pDb->zName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iDb), 0, zDb) ){
      goto exit_create_index;
    }
    i = SQLITE_CREATE_INDEX;
    if( !OMIT_TEMPDB && iDb==1 ) i = SQLITE_CREATE_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, i, zName, pTab->zName, zDb) ){
      goto exit_create_index;
    }
  }
#endif

  /* If pList==0, it means this routine was called to make a primary
  ** key out of the last column added to the table under construction.
  ** So create a fake list to simulate this.
  */
  if( pList==0 ){
    pList = sqlite3ExprListAppend(pParse, 0, 0);
    if( pList==0 ) goto exit_create_index;
    pList->a[0].zName = sqlite3DbStrDup(pParse->db,
                                        pTab->aCol[pTab->nCol-1].zName);
    pList->a[0].sortOrder = (u8)sortOrder;
  }

  /* Figure out how many bytes of space are required to store explicitly
  ** specified collation sequence names.
  */
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    if( pExpr ){
      assert( pExpr->op==TK_COLLATE );
      nExtra += (1 + sqlite3Strlen30(pExpr->u.zToken));
    }
  }

  /* 
  ** Allocate the index structure. 
  */
  nName = sqlite3Strlen30(zName);
  nExtraCol = pPk ? pPk->nKeyCol : 1;
  pIndex = sqlite3AllocateIndexObject(db, pList->nExpr + nExtraCol,
                                      nName + nExtra + 1, &zExtra);
  if( db->mallocFailed ){
    goto exit_create_index;
  }
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->aiRowLogEst) );
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->azColl) );
  pIndex->zName = zExtra;
  zExtra += nName + 1;
  memcpy(pIndex->zName, zName, nName+1);
  pIndex->pTable = pTab;
  pIndex->onError = (u8)onError;
  pIndex->uniqNotNull = onError!=OE_None;
  pIndex->idxType = pName ? SQLITE_IDXTYPE_APPDEF : SQLITE_IDXTYPE_UNIQUE;
  pIndex->pSchema = db->aDb[iDb].pSchema;
  pIndex->nKeyCol = pList->nExpr;
  if( pPIWhere ){
    sqlite3ResolveSelfReference(pParse, pTab, NC_PartIdx, pPIWhere, 0);
    pIndex->pPartIdxWhere = pPIWhere;
    pPIWhere = 0;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );

  /* Check to see if we should honor DESC requests on index columns
  */
  if( pDb->pSchema->file_format>=4 ){
    sortOrderMask = -1;   /* Honor DESC */
  }else{
    sortOrderMask = 0;    /* Ignore DESC */
  }

  /* Scan the names of the columns of the table to be indexed and
  ** load the column indices into the Index structure.  Report an error
  ** if any column is not found.
  **
  ** TODO:  Add a test to make sure that the same column is not named
  ** more than once within the same index.  Only the first instance of
  ** the column will ever be used by the optimizer.  Note that using the
  ** same column more than once cannot be an error because that would 
  ** break backwards compatibility - it needs to be a warning.
  */
  for(i=0, pListItem=pList->a; i<pList->nExpr; i++, pListItem++){
    const char *zColName = pListItem->zName;
    int requestedSortOrder;
    char *zColl;                   /* Collation sequence name */

    for(j=0, pTabCol=pTab->aCol; j<pTab->nCol; j++, pTabCol++){
      if( sqlite3StrICmp(zColName, pTabCol->zName)==0 ) break;
    }
    if( j>=pTab->nCol ){
      sqlite3ErrorMsg(pParse, "table %s has no column named %s",
        pTab->zName, zColName);
      pParse->checkSchema = 1;
      goto exit_create_index;
    }
    assert( j<=0x7fff );
    pIndex->aiColumn[i] = (i16)j;
    if( pListItem->pExpr ){
      int nColl;
      assert( pListItem->pExpr->op==TK_COLLATE );
      zColl = pListItem->pExpr->u.zToken;
      nColl = sqlite3Strlen30(zColl) + 1;
      assert( nExtra>=nColl );
      memcpy(zExtra, zColl, nColl);
      zColl = zExtra;
      zExtra += nColl;
      nExtra -= nColl;
    }else{
      zColl = pTab->aCol[j].zColl;
      if( !zColl ) zColl = "BINARY";
    }
    if( !db->init.busy && !sqlite3LocateCollSeq(pParse, zColl) ){
      goto exit_create_index;
    }
    pIndex->azColl[i] = zColl;
    requestedSortOrder = pListItem->sortOrder & sortOrderMask;
    pIndex->aSortOrder[i] = (u8)requestedSortOrder;
    if( pTab->aCol[j].notNull==0 ) pIndex->uniqNotNull = 0;
  }
  if( pPk ){
    for(j=0; j<pPk->nKeyCol; j++){
      int x = pPk->aiColumn[j];
      if( hasColumn(pIndex->aiColumn, pIndex->nKeyCol, x) ){
        pIndex->nColumn--; 
      }else{
        pIndex->aiColumn[i] = x;
        pIndex->azColl[i] = pPk->azColl[j];
        pIndex->aSortOrder[i] = pPk->aSortOrder[j];
        i++;
      }
    }
    assert( i==pIndex->nColumn );
  }else{
    pIndex->aiColumn[i] = -1;
    pIndex->azColl[i] = "BINARY";
  }
  sqlite3DefaultRowEst(pIndex);
  if( pParse->pNewTable==0 ) estimateIndexWidth(pIndex);

  if( pTab==pParse->pNewTable ){
    /* This routine has been called to create an automatic index as a
    ** result of a PRIMARY KEY or UNIQUE clause on a column definition, or
    ** a PRIMARY KEY or UNIQUE clause following the column definitions.
    ** i.e. one of:
    **
    ** CREATE TABLE t(x PRIMARY KEY, y);
    ** CREATE TABLE t(x, y, UNIQUE(x, y));
    **
    ** Either way, check to see if the table already has such an index. If
    ** so, don't bother creating this one. This only applies to
    ** automatically created indices. Users can do as they wish with
    ** explicit indices.
    **
    ** Two UNIQUE or PRIMARY KEY constraints are considered equivalent
    ** (and thus suppressing the second one) even if they have different
    ** sort orders.
    **
    ** If there are different collating sequences or if the columns of
    ** the constraint occur in different orders, then the constraints are
    ** considered distinct and both result in separate indices.
    */
    Index *pIdx;
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int k;
      assert( IsUniqueIndex(pIdx) );
      assert( pIdx->idxType!=SQLITE_IDXTYPE_APPDEF );
      assert( IsUniqueIndex(pIndex) );

      if( pIdx->nKeyCol!=pIndex->nKeyCol ) continue;
      for(k=0; k<pIdx->nKeyCol; k++){
        const char *z1;
        const char *z2;
        if( pIdx->aiColumn[k]!=pIndex->aiColumn[k] ) break;
        z1 = pIdx->azColl[k];
        z2 = pIndex->azColl[k];
        if( z1!=z2 && sqlite3StrICmp(z1, z2) ) break;
      }
      if( k==pIdx->nKeyCol ){
        if( pIdx->onError!=pIndex->onError ){
          /* This constraint creates the same index as a previous
          ** constraint specified somewhere in the CREATE TABLE statement.
          ** However the ON CONFLICT clauses are different. If both this 
          ** constraint and the previous equivalent constraint have explicit
          ** ON CONFLICT clauses this is an error. Otherwise, use the
          ** explicitly specified behavior for the index.
          */
          if( !(pIdx->onError==OE_Default || pIndex->onError==OE_Default) ){
            sqlite3ErrorMsg(pParse, 
                "conflicting ON CONFLICT clauses specified", 0);
          }
          if( pIdx->onError==OE_Default ){
            pIdx->onError = pIndex->onError;
          }
        }
        pRet = pIdx;
        goto exit_create_index;
      }
    }
  }

  /* Link the new Index structure to its table and to the other
  ** in-memory database structures. 
  */
  if( db->init.busy ){
    Index *p;
    assert( sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
    p = sqlite3HashInsert(&pIndex->pSchema->idxHash, 
                          pIndex->zName, pIndex);
    if( p ){
      assert( p==pIndex );  /* Malloc must have failed */
      db->mallocFailed = 1;
      goto exit_create_index;
    }
    db->flags |= SQLITE_InternChanges;
    if( pTblName!=0 ){
      pIndex->tnum = db->init.newTnum;
    }
  }

  /* If this is the initial CREATE INDEX statement (or CREATE TABLE if the
  ** index is an implied index for a UNIQUE or PRIMARY KEY constraint) then
  ** emit code to allocate the index rootpage on disk and make an entry for
  ** the index in the sqlite_master table and populate the index with
  ** content.  But, do not do this if we are simply reading the sqlite_master
  ** table to parse the schema, or if this index is the PRIMARY KEY index
  ** of a WITHOUT ROWID table.
  **
  ** If pTblName==0 it means this index is generated as an implied PRIMARY KEY
  ** or UNIQUE index in a CREATE TABLE statement.  Since the table
  ** has just been created, it contains no data and the index initialization
  ** step can be skipped.
  */
  else if( pParse->nErr==0 && (HasRowid(pTab) || pTblName!=0) ){
    Vdbe *v;
    char *zStmt;
    int iMem = ++pParse->nMem;

    v = sqlite3GetVdbe(pParse);
    if( v==0 ) goto exit_create_index;


    /* Create the rootpage for the index
    */
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    sqlite3VdbeAddOp2(v, OP_CreateIndex, iDb, iMem);

    /* Gather the complete text of the CREATE INDEX statement into
    ** the zStmt variable
    */
    if( pStart ){
      int n = (int)(pParse->sLastToken.z - pName->z) + pParse->sLastToken.n;
      if( pName->z[n-1]==';' ) n--;
      /* A named index with an explicit CREATE INDEX statement */
      zStmt = sqlite3MPrintf(db, "CREATE%s INDEX %.*s",
        onError==OE_None ? "" : " UNIQUE", n, pName->z);
    }else{
      /* An automatic index created by a PRIMARY KEY or UNIQUE constraint */
      /* zStmt = sqlite3MPrintf(""); */
      zStmt = 0;
    }

    /* Add an entry in sqlite_master for this index
    */
    sqlite3NestedParse(pParse, 
        "INSERT INTO %Q.%s VALUES('index',%Q,%Q,#%d,%Q);",
        db->aDb[iDb].zName, SCHEMA_TABLE(iDb),
        pIndex->zName,
        pTab->zName,
        iMem,
        zStmt
    );
    sqlite3DbFree(db, zStmt);

    /* Fill the index with data and reparse the schema. Code an OP_Expire
    ** to invalidate all pre-compiled statements.
    */
    if( pTblName ){
      sqlite3RefillIndex(pParse, pIndex, iMem);
      sqlite3ChangeCookie(pParse, iDb);
      sqlite3VdbeAddParseSchemaOp(v, iDb,
         sqlite3MPrintf(db, "name='%q' AND type='index'", pIndex->zName));
      sqlite3VdbeAddOp1(v, OP_Expire, 0);
    }
  }

  /* When adding an index to the list of indices for a table, make
  ** sure all indices labeled OE_Replace come after all those labeled
  ** OE_Ignore.  This is necessary for the correct constraint check
  ** processing (in sqlite3GenerateConstraintChecks()) as part of
  ** UPDATE and INSERT statements.  
  */
  if( db->init.busy || pTblName==0 ){
    if( onError!=OE_Replace || pTab->pIndex==0
         || pTab->pIndex->onError==OE_Replace){
      pIndex->pNext = pTab->pIndex;
      pTab->pIndex = pIndex;
    }else{
      Index *pOther = pTab->pIndex;
      while( pOther->pNext && pOther->pNext->onError!=OE_Replace ){
        pOther = pOther->pNext;
      }
      pIndex->pNext = pOther->pNext;
      pOther->pNext = pIndex;
    }
    pRet = pIndex;
    pIndex = 0;
  }

  /* Clean up before exiting */
exit_create_index:
  if( pIndex ) freeIndex(db, pIndex);
  sqlite3ExprDelete(db, pPIWhere);
  sqlite3ExprListDelete(db, pList);
  sqlite3SrcListDelete(db, pTblName);
  sqlite3DbFree(db, zName);
  return pRet;
}